

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool xatlas::internal::Fit::EigenSolver3_QLAlgorithm(float (*mat) [3],float *diag,float *subd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int local_60;
  int k;
  float b;
  float f;
  int i;
  float p;
  float c;
  float s;
  float r;
  float g;
  float dd;
  int m;
  int iter;
  int ell;
  int maxiter;
  float *subd_local;
  float *diag_local;
  float (*mat_local) [3];
  
  m = 0;
  do {
    if (2 < m) {
      return true;
    }
    for (dd = 0.0; (int)dd < 0x20; dd = (float)((int)dd + 1)) {
      for (g = (float)m; (int)g < 2; g = (float)((int)g + 1)) {
        fVar1 = ABS(diag[(int)g]) + ABS(diag[(int)g + 1]);
        if ((ABS(subd[(int)g]) + fVar1 == fVar1) && (!NAN(ABS(subd[(int)g]) + fVar1) && !NAN(fVar1))
           ) break;
      }
      if (g == (float)m) break;
      fVar1 = (diag[m + 1] - diag[m]) / (subd[m] * 2.0);
      fVar2 = sqrtf(fVar1 * fVar1 + 1.0);
      if (0.0 <= fVar1) {
        s = (diag[(int)g] - diag[m]) + subd[m] / (fVar1 + fVar2);
      }
      else {
        s = (diag[(int)g] - diag[m]) + subd[m] / (fVar1 - fVar2);
      }
      p = 1.0;
      i = 0x3f800000;
      f = 0.0;
      fVar1 = g;
      while (fVar2 = fVar1, b = (float)((int)fVar2 + -1), m <= (int)b) {
        fVar3 = p * subd[(int)b];
        fVar1 = (float)i * subd[(int)b];
        if (ABS(fVar3) < ABS(s)) {
          fVar3 = fVar3 / s;
          fVar4 = sqrtf(fVar3 * fVar3 + 1.0);
          subd[(int)fVar2] = s * fVar4;
          i = (int)(1.0 / fVar4);
          p = (float)i * fVar3;
        }
        else {
          fVar4 = s / fVar3;
          fVar5 = sqrtf(fVar4 * fVar4 + 1.0);
          subd[(int)fVar2] = fVar3 * fVar5;
          p = 1.0 / fVar5;
          i = (int)(p * fVar4);
        }
        fVar3 = diag[(int)fVar2] - f;
        fVar4 = (diag[(int)b] - fVar3) * p + fVar1 * 2.0 * (float)i;
        f = p * fVar4;
        diag[(int)fVar2] = fVar3 + f;
        s = (float)i * fVar4 + -fVar1;
        for (local_60 = 0; fVar1 = b, local_60 < 3; local_60 = local_60 + 1) {
          fVar1 = mat[local_60][(int)fVar2];
          mat[local_60][(int)fVar2] = p * mat[local_60][(int)b] + (float)i * fVar1;
          mat[local_60][(int)b] = (float)i * mat[local_60][(int)b] + -(p * fVar1);
        }
      }
      diag[m] = diag[m] - f;
      subd[m] = s;
      subd[(int)g] = 0.0;
    }
    if (dd == 4.48416e-44) {
      return false;
    }
    m = m + 1;
  } while( true );
}

Assistant:

static bool EigenSolver3_QLAlgorithm(float mat[3][3], float *diag, float *subd)
	{
		// QL iteration with implicit shifting to reduce matrix from tridiagonal
		// to diagonal
		const int maxiter = 32;
		for (int ell = 0; ell < 3; ell++) {
			int iter;
			for (iter = 0; iter < maxiter; iter++) {
				int m;
				for (m = ell; m <= 1; m++) {
					float dd = fabsf(diag[m]) + fabsf(diag[m + 1]);
					if ( fabsf(subd[m]) + dd == dd )
						break;
				}
				if ( m == ell )
					break;
				float g = (diag[ell + 1] - diag[ell]) / (2 * subd[ell]);
				float r = sqrtf(g * g + 1);
				if ( g < 0 )
					g = diag[m] - diag[ell] + subd[ell] / (g - r);
				else
					g = diag[m] - diag[ell] + subd[ell] / (g + r);
				float s = 1, c = 1, p = 0;
				for (int i = m - 1; i >= ell; i--) {
					float f = s * subd[i], b = c * subd[i];
					if ( fabsf(f) >= fabsf(g) ) {
						c = g / f;
						r = sqrtf(c * c + 1);
						subd[i + 1] = f * r;
						c *= (s = 1 / r);
					} else {
						s = f / g;
						r = sqrtf(s * s + 1);
						subd[i + 1] = g * r;
						s *= (c = 1 / r);
					}
					g = diag[i + 1] - p;
					r = (diag[i] - g) * s + 2 * b * c;
					p = s * r;
					diag[i + 1] = g + p;
					g = c * r - b;
					for (int k = 0; k < 3; k++) {
						f = mat[k][i + 1];
						mat[k][i + 1] = s * mat[k][i] + c * f;
						mat[k][i] = c * mat[k][i] - s * f;
					}
				}
				diag[ell] -= p;
				subd[ell] = g;
				subd[m] = 0;
			}
			if ( iter == maxiter )
				// should not get here under normal circumstances
				return false;
		}
		return true;
	}